

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O2

LazyObject * __thiscall Assimp::FBX::Document::GetObject(Document *this,uint64_t id)

{
  const_iterator cVar1;
  LazyObject *pLVar2;
  uint64_t local_10;
  
  local_10 = id;
  cVar1 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>,_std::_Select1st<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
          ::find(&(this->objects)._M_t,&local_10);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->objects)._M_t._M_impl.super__Rb_tree_header) {
    pLVar2 = (LazyObject *)0x0;
  }
  else {
    pLVar2 = (LazyObject *)cVar1._M_node[1]._M_parent;
  }
  return pLVar2;
}

Assistant:

LazyObject* Document::GetObject(uint64_t id) const
{
    ObjectMap::const_iterator it = objects.find(id);
    return it == objects.end() ? nullptr : (*it).second;
}